

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

Float __thiscall pbrt::BilinearPatch::PDF(BilinearPatch *this,ShapeSampleContext *ctx,Vector3f wi)

{
  int iVar1;
  int iVar2;
  BilinearPatchMesh *mesh;
  int *piVar3;
  Point3f *pPVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  long lVar8;
  ShapeIntersection *pSVar9;
  Point3<float> *p2;
  Normal3f *n;
  Point3<float> *this_00;
  Point3<float> *this_01;
  Point3<float> *this_02;
  Point3<float> *this_03;
  undefined1 auVar10 [16];
  Float FVar11;
  type tVar12;
  float fVar13;
  undefined1 auVar14 [16];
  Point2f p;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 extraout_var_03 [56];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  Point3f PVar47;
  Vector3<float> VVar48;
  Vector3f a;
  Vector3f a_00;
  Vector3f b;
  Vector3f b_00;
  Vector3f c;
  Vector3f c_00;
  Vector3f d;
  Vector3f d_00;
  initializer_list<float> v;
  span<const_float> w_00;
  Tuple3<pbrt::Point3,_float> local_288;
  undefined4 local_27c;
  undefined1 local_278 [16];
  float local_268;
  float local_264;
  float local_260;
  float local_25c;
  Tuple3<pbrt::Point3,_float> local_258;
  undefined1 local_248 [16];
  array<float,_4> w;
  Tuple3<pbrt::Vector3,_float> local_218;
  Vector3f local_208;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  Tuple3<pbrt::Vector3,_float> local_1d0;
  Tuple3<pbrt::Vector3,_float> local_1c0;
  Tuple3<pbrt::Vector3,_float> local_1b0;
  Tuple3<pbrt::Vector3,_float> local_1a0;
  Tuple3<pbrt::Vector3,_float> local_190;
  Tuple3<pbrt::Vector3,_float> local_180;
  Tuple3<pbrt::Vector3,_float> local_170;
  optional<pbrt::ShapeIntersection> isect;
  Ray ray;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar46 [56];
  
  local_278._8_8_ = local_278._0_8_;
  local_208.super_Tuple3<pbrt::Vector3,_float>.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar15._8_56_ = wi._8_56_;
  auVar15._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar15._0_16_);
  ShapeSampleContext::SpawnRay(&ray,ctx,&local_208);
  auVar46 = (undefined1  [56])0x0;
  Intersect(&isect,this,&ray,INFINITY);
  auVar10 = ZEXT816(0) << 0x40;
  if (isect.set == true) {
    mesh = *(BilinearPatchMesh **)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
    lVar8 = (long)this->blpIndex;
    piVar3 = mesh->vertexIndices;
    pPVar4 = mesh->p;
    iVar1 = piVar3[lVar8 * 4];
    iVar2 = piVar3[lVar8 * 4 + 1];
    local_278._0_8_ = (long)piVar3[lVar8 * 4 + 2];
    local_248._0_8_ = (long)piVar3[lVar8 * 4 + 3];
    PVar47 = ShapeSampleContext::p(ctx);
    local_288.z = PVar47.super_Tuple3<pbrt::Point3,_float>.z;
    auVar16._0_8_ = PVar47.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar16._8_56_ = auVar46;
    local_288._0_8_ = vmovlps_avx(auVar16._0_16_);
    this_03 = pPVar4 + iVar1;
    VVar48 = Point3<float>::operator-(this_03,(Point3<float> *)&local_288);
    w.values[2] = VVar48.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar17._0_8_ = VVar48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar17._8_56_ = auVar46;
    w.values._0_8_ = vmovlps_avx(auVar17._0_16_);
    VVar48 = Normalize<float>((Vector3<float> *)&w);
    local_25c = VVar48.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar18._0_8_ = VVar48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar18._8_56_ = auVar46;
    local_1e8 = auVar18._0_16_;
    PVar47 = ShapeSampleContext::p(ctx);
    local_288.z = PVar47.super_Tuple3<pbrt::Point3,_float>.z;
    auVar19._0_8_ = PVar47.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar19._8_56_ = auVar46;
    local_288._0_8_ = vmovlps_avx(auVar19._0_16_);
    this_00 = pPVar4 + iVar2;
    VVar48 = Point3<float>::operator-(this_00,(Point3<float> *)&local_288);
    w.values[2] = VVar48.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar20._0_8_ = VVar48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar20._8_56_ = auVar46;
    w.values._0_8_ = vmovlps_avx(auVar20._0_16_);
    VVar48 = Normalize<float>((Vector3<float> *)&w);
    local_260 = VVar48.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar21._0_8_ = VVar48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar21._8_56_ = auVar46;
    local_1f8 = auVar21._0_16_;
    PVar47 = ShapeSampleContext::p(ctx);
    local_288.z = PVar47.super_Tuple3<pbrt::Point3,_float>.z;
    auVar22._0_8_ = PVar47.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar22._8_56_ = auVar46;
    local_288._0_8_ = vmovlps_avx(auVar22._0_16_);
    this_02 = pPVar4 + local_278._0_8_;
    VVar48 = Point3<float>::operator-(this_02,(Point3<float> *)&local_288);
    w.values[2] = VVar48.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar23._0_8_ = VVar48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar23._8_56_ = auVar46;
    w.values._0_8_ = vmovlps_avx(auVar23._0_16_);
    VVar48 = Normalize<float>((Vector3<float> *)&w);
    local_264 = VVar48.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar24._0_8_ = VVar48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar24._8_56_ = auVar46;
    local_278 = auVar24._0_16_;
    PVar47 = ShapeSampleContext::p(ctx);
    local_288.z = PVar47.super_Tuple3<pbrt::Point3,_float>.z;
    auVar25._0_8_ = PVar47.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar25._8_56_ = auVar46;
    local_288._0_8_ = vmovlps_avx(auVar25._0_16_);
    this_01 = pPVar4 + local_248._0_8_;
    VVar48 = Point3<float>::operator-(this_01,(Point3<float> *)&local_288);
    w.values[2] = VVar48.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar26._0_8_ = VVar48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar26._8_56_ = auVar46;
    w.values._0_8_ = vmovlps_avx(auVar26._0_16_);
    VVar48 = Normalize<float>((Vector3<float> *)&w);
    local_268 = VVar48.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar27._0_8_ = VVar48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar27._8_56_ = auVar46;
    local_248 = auVar27._0_16_;
    bVar7 = IsRectangle(this,mesh);
    auVar6 = local_1e8;
    auVar5 = local_1f8;
    auVar14 = local_248;
    auVar10 = local_278;
    if ((bVar7) && (mesh->imageDistribution == (PiecewiseConstant2D *)0x0)) {
      a.super_Tuple3<pbrt::Vector3,_float>.z = local_25c;
      a.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1e8._0_4_;
      a.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1e8._4_4_;
      b.super_Tuple3<pbrt::Vector3,_float>.z = local_260;
      b.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1f8._0_4_;
      b.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1f8._4_4_;
      c.super_Tuple3<pbrt::Vector3,_float>.z = local_268;
      c.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_248._0_4_;
      c.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_248._4_4_;
      d.super_Tuple3<pbrt::Vector3,_float>.z = local_264;
      d.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_278._0_4_;
      d.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_278._4_4_;
      local_278 = auVar10;
      local_248 = auVar14;
      local_1f8 = auVar5;
      local_1e8 = auVar6;
      FVar11 = SphericalQuadArea(a,b,c,d);
      auVar6 = local_1e8;
      auVar5 = local_1f8;
      auVar14 = local_248;
      auVar10 = local_278;
      if (0.0001 < FVar11) {
        a_00.super_Tuple3<pbrt::Vector3,_float>.z = local_25c;
        a_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1e8._0_4_;
        a_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1e8._4_4_;
        b_00.super_Tuple3<pbrt::Vector3,_float>.z = local_260;
        b_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1f8._0_4_;
        b_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1f8._4_4_;
        c_00.super_Tuple3<pbrt::Vector3,_float>.z = local_268;
        c_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_248._0_4_;
        c_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_248._4_4_;
        d_00.super_Tuple3<pbrt::Vector3,_float>.z = local_264;
        d_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_278._0_4_;
        d_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_278._4_4_;
        local_278 = auVar10;
        local_248 = auVar14;
        local_1f8 = auVar5;
        local_1e8 = auVar6;
        FVar11 = SphericalQuadArea(a_00,b_00,c_00,d_00);
        auVar10 = ZEXT416((uint)(1.0 / FVar11));
        auVar46 = ZEXT456(0);
        if (((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x == 0.0) &&
           ((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y == 0.0)) {
          fVar13 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
          auVar46 = (undefined1  [56])0x0;
          if ((fVar13 == 0.0) && (!NAN(fVar13))) goto LAB_00267677;
        }
        local_278 = auVar10;
        PVar47 = ShapeSampleContext::p(ctx);
        local_258.z = PVar47.super_Tuple3<pbrt::Point3,_float>.z;
        auVar30._0_8_ = PVar47.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar30._8_56_ = auVar46;
        local_258._0_8_ = vmovlps_avx(auVar30._0_16_);
        VVar48 = Point3<float>::operator-(this_03,(Point3<float> *)&local_258);
        local_1d0.z = VVar48.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar31._0_8_ = VVar48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar31._8_56_ = auVar46;
        local_1d0._0_8_ = vmovlps_avx(auVar31._0_16_);
        VVar48 = Normalize<float>((Vector3<float> *)&local_1d0);
        local_218.z = VVar48.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar32._0_8_ = VVar48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar32._8_56_ = auVar46;
        n = &ctx->ns;
        local_218._0_8_ = vmovlps_avx(auVar32._0_16_);
        auVar33._0_4_ = AbsDot<float>((Vector3<float> *)&local_218,n);
        auVar33._4_60_ = extraout_var;
        auVar10 = vmaxss_avx(auVar33._0_16_,ZEXT416(0x3c23d70a));
        auVar46 = ZEXT856(auVar10._8_8_);
        local_288.x = auVar10._0_4_;
        VVar48 = Point3<float>::operator-(this_00,(Point3<float> *)&local_258);
        local_180.z = VVar48.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar34._0_8_ = VVar48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar34._8_56_ = auVar46;
        local_180._0_8_ = vmovlps_avx(auVar34._0_16_);
        VVar48 = Normalize<float>((Vector3<float> *)&local_180);
        local_170.z = VVar48.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar35._0_8_ = VVar48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar35._8_56_ = auVar46;
        local_170._0_8_ = vmovlps_avx(auVar35._0_16_);
        auVar36._0_4_ = AbsDot<float>((Vector3<float> *)&local_170,n);
        auVar36._4_60_ = extraout_var_00;
        auVar10 = vmaxss_avx(auVar36._0_16_,ZEXT416(0x3c23d70a));
        auVar46 = ZEXT856(auVar10._8_8_);
        local_288.y = auVar10._0_4_;
        VVar48 = Point3<float>::operator-(this_02,(Point3<float> *)&local_258);
        local_1a0.z = VVar48.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar37._0_8_ = VVar48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar37._8_56_ = auVar46;
        local_1a0._0_8_ = vmovlps_avx(auVar37._0_16_);
        VVar48 = Normalize<float>((Vector3<float> *)&local_1a0);
        local_190.z = VVar48.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar38._0_8_ = VVar48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar38._8_56_ = auVar46;
        local_190._0_8_ = vmovlps_avx(auVar38._0_16_);
        auVar39._0_4_ = AbsDot<float>((Vector3<float> *)&local_190,n);
        auVar39._4_60_ = extraout_var_01;
        auVar10 = vmaxss_avx(auVar39._0_16_,ZEXT416(0x3c23d70a));
        auVar46 = ZEXT856(auVar10._8_8_);
        local_288.z = auVar10._0_4_;
        VVar48 = Point3<float>::operator-(this_01,(Point3<float> *)&local_258);
        local_1c0.z = VVar48.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar40._0_8_ = VVar48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar40._8_56_ = auVar46;
        local_1c0._0_8_ = vmovlps_avx(auVar40._0_16_);
        VVar48 = Normalize<float>((Vector3<float> *)&local_1c0);
        local_1b0.z = VVar48.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar41._0_8_ = VVar48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar41._8_56_ = auVar46;
        local_1b0._0_8_ = vmovlps_avx(auVar41._0_16_);
        auVar42._0_4_ = AbsDot<float>((Vector3<float> *)&local_1b0,n);
        auVar42._4_60_ = extraout_var_02;
        auVar10 = vmaxss_avx(auVar42._0_16_,ZEXT416(0x3c23d70a));
        auVar46 = ZEXT856(auVar10._8_8_);
        local_27c = auVar10._0_4_;
        v._M_len = 4;
        v._M_array = &local_288.x;
        pstd::array<float,_4>::array(&w,v);
        VVar48 = Point3<float>::operator-(this_00,this_03);
        local_288.z = VVar48.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar43._0_8_ = VVar48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar43._8_56_ = auVar46;
        local_288._0_8_ = vmovlps_avx(auVar43._0_16_);
        VVar48 = Point3<float>::operator-(this_02,this_03);
        local_218.z = VVar48.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar44._0_8_ = VVar48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar44._8_56_ = auVar46;
        local_218._0_8_ = vmovlps_avx(auVar44._0_16_);
        pSVar9 = pstd::optional<pbrt::ShapeIntersection>::value(&isect);
        PVar47 = Interaction::p((Interaction *)pSVar9);
        local_1d0.z = PVar47.super_Tuple3<pbrt::Point3,_float>.z;
        auVar45._0_8_ = PVar47.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar45._8_56_ = auVar46;
        local_1d0._0_8_ = vmovlps_avx(auVar45._0_16_);
        p = InvertSphericalRectangleSample
                      ((Point3f *)&local_258,this_03,(Vector3f *)&local_288,(Vector3f *)&local_218,
                       (Point3f *)&local_1d0);
        w_00.n = 4;
        w_00.ptr = w.values;
        FVar11 = BilinearPDF(p,w_00);
        auVar10 = ZEXT416((uint)((float)local_278._0_4_ * FVar11));
        goto LAB_00267677;
      }
    }
    pSVar9 = pstd::optional<pbrt::ShapeIntersection>::value(&isect);
    FVar11 = PDF(this,(Interaction *)pSVar9);
    local_278._0_4_ = FVar11;
    pSVar9 = pstd::optional<pbrt::ShapeIntersection>::value(&isect);
    auVar14._0_8_ = local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
    auVar14._8_4_ = 0x80000000;
    auVar14._12_4_ = 0x80000000;
    w.values[2] = -local_208.super_Tuple3<pbrt::Vector3,_float>.z;
    w.values._0_8_ = vmovlps_avx(auVar14);
    tVar12 = AbsDot<float>(&(pSVar9->intr).super_Interaction.n,(Vector3<float> *)&w);
    local_248._0_4_ = tVar12;
    auVar46 = extraout_var_03;
    PVar47 = ShapeSampleContext::p(ctx);
    local_288.z = PVar47.super_Tuple3<pbrt::Point3,_float>.z;
    auVar28._0_8_ = PVar47.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar28._8_56_ = auVar46;
    local_288._0_8_ = vmovlps_avx(auVar28._0_16_);
    pSVar9 = pstd::optional<pbrt::ShapeIntersection>::value(&isect);
    PVar47 = Interaction::p((Interaction *)pSVar9);
    local_258.z = PVar47.super_Tuple3<pbrt::Point3,_float>.z;
    auVar29._0_8_ = PVar47.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar29._8_56_ = auVar46;
    local_258._0_8_ = vmovlps_avx(auVar29._0_16_);
    fVar13 = DistanceSquared<float>((pbrt *)&local_288,(Point3<float> *)&local_258,p2);
    fVar13 = (float)local_278._0_4_ / ((float)local_248._0_4_ / fVar13);
    auVar10._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar10._0_4_ = (uint)(ABS(fVar13) != INFINITY) * (int)fVar13;
  }
LAB_00267677:
  local_278 = auVar10;
  pstd::optional<pbrt::ShapeIntersection>::~optional(&isect);
  return (Float)local_278._0_4_;
}

Assistant:

Float BilinearPatch::PDF(const ShapeSampleContext &ctx, Vector3f wi) const {
    // Intersect sample ray with shape geometry
    Ray ray = ctx.SpawnRay(wi);
    pstd::optional<ShapeIntersection> isect = Intersect(ray);
    if (!isect)
        return 0;

    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    // Find normalized vectors to corners of bilinear patch
    Vector3f v00 = Normalize(p00 - ctx.p()), v10 = Normalize(p10 - ctx.p());
    Vector3f v01 = Normalize(p01 - ctx.p()), v11 = Normalize(p11 - ctx.p());

    if (IsRectangle(mesh) && !mesh->imageDistribution &&
        SphericalQuadArea(v00, v10, v11, v01) > MinSphericalSampleArea) {
        // Return PDF for sample in spherical rectangle
        Float pdf = 1 / SphericalQuadArea(v00, v10, v11, v01);
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Compute $\cos \theta$ weights for rectangle seen from _ctx.p()_
            Point3f rp = ctx.p();
            pstd::array<Float, 4> w = pstd::array<Float, 4>{
                std::max<Float>(0.01, AbsDot(Normalize(p00 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p10 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p01 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p11 - rp), ctx.ns))};

            Point2f u = InvertSphericalRectangleSample(rp, p00, p10 - p00, p01 - p00,
                                                       isect->intr.p());
            return BilinearPDF(u, w) * pdf;
        } else
            return pdf;

    } else {
        // Return solid angle PDF for sampling bilinear patch at _intr_
        Float pdf = PDF(isect->intr) / (AbsDot(isect->intr.n, -wi) /
                                        DistanceSquared(ctx.p(), isect->intr.p()));
        if (IsInf(pdf))
            pdf = 0;
        return pdf;
    }
}